

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

void spawn_stdin_stdout(void)

{
  int *piVar1;
  ssize_t sVar2;
  bool bVar3;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  ssize_t c;
  ssize_t w;
  ssize_t r;
  char *pbuf;
  char buf [1024];
  
  do {
    do {
      eval_a = read(0,&pbuf,0x400);
      bVar3 = false;
      if (eval_a == -1) {
        piVar1 = __errno_location();
        bVar3 = *piVar1 == 4;
      }
    } while (bVar3);
    if (eval_a == 0) {
      return;
    }
    if (eval_a < 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x867,"r",">","0",eval_a,">",0);
      abort();
    }
    r = (ssize_t)&pbuf;
    for (; eval_a != 0; eval_a = eval_a - sVar2) {
      do {
        sVar2 = write(1,(void *)r,eval_a);
        bVar3 = false;
        if (sVar2 == -1) {
          piVar1 = __errno_location();
          bVar3 = *piVar1 == 4;
        }
      } while (bVar3);
      if (sVar2 < 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x86e,"w",">=","0",sVar2,">=",0);
        abort();
      }
      r = r + sVar2;
    }
  } while( true );
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT_GT(r, 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT_GE(w, 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}